

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>::setTextureSize
          (ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *this,uint32_t sizeX_,
          uint32_t sizeY_)

{
  allocator local_41;
  string local_40;
  
  if (this->deviceBufferType != Attribute) {
    std::__cxx11::string::string
              ((string *)&local_40,"managed buffer can only be set as texture once",&local_41);
    exception(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  this->deviceBufferType = Texture2d;
  this->sizeX = sizeX_;
  this->sizeY = sizeY_;
  return;
}

Assistant:

void ManagedBuffer<T>::setTextureSize(uint32_t sizeX_, uint32_t sizeY_) {
  if (deviceBufferType != DeviceBufferType::Attribute) exception("managed buffer can only be set as texture once");

  deviceBufferType = DeviceBufferType::Texture2d;
  sizeX = sizeX_;
  sizeY = sizeY_;
}